

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::AnyMetadata::InternalIs(AnyMetadata *this,Descriptor *descriptor)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string full_name;
  string type_url;
  string local_60;
  string local_40;
  
  psVar1 = this->type_url_->ptr_;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + psVar1->_M_string_length);
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar3 = ParseAnyTypeUrl(&local_40,&local_60);
  if (bVar3) {
    if (local_60._M_string_length == (*(undefined8 **)(descriptor + 8))[1]) {
      if (local_60._M_string_length == 0) {
        bVar3 = true;
      }
      else {
        iVar4 = bcmp(local_60._M_dataplus._M_p,(void *)**(undefined8 **)(descriptor + 8),
                     local_60._M_string_length);
        bVar3 = iVar4 == 0;
      }
      goto LAB_005fc77f;
    }
  }
  bVar3 = false;
LAB_005fc77f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool AnyMetadata::InternalIs(const Descriptor* descriptor) const {
  const string type_url = type_url_->GetNoArena();
  string full_name;
  if (!ParseAnyTypeUrl(type_url, &full_name)) {
    return false;
  }
  return full_name == descriptor->full_name();
}